

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::i2p_alert::message_abi_cxx11_(string *__return_storage_ptr__,i2p_alert *this)

{
  error_category *peVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  char msg [600];
  string local_2b8;
  string local_298;
  char local_278 [608];
  
  iVar2 = (**((this->error).cat_)->_vptr_error_category)();
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_2b8,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_298,&local_2b8);
  snprintf(local_278,600,"i2p_error: [%s] %s",CONCAT44(extraout_var,iVar2),
           local_298._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_278);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_278,local_278 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string i2p_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "i2p_error: [%s] %s"
			, error.category().name(), convert_from_native(error.message()).c_str());
		return msg;
	}